

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-abandon.c
# Opt level: O0

void mi_arena_segment_os_mark_abandoned(mi_segment_t *segment)

{
  long *plVar1;
  long lVar2;
  bool bVar3;
  long in_RDI;
  mi_segment_t *prev;
  _Bool _go;
  mi_subproc_t *subproc;
  pthread_mutex_t *in_stack_ffffffffffffffc0;
  
  plVar1 = *(long **)(in_RDI + 0x28);
  mi_lock_acquire(in_stack_ffffffffffffffc0);
  bVar3 = true;
  while (bVar3) {
    lVar2 = plVar1[0xd];
    if (lVar2 == 0) {
      plVar1[0xc] = in_RDI;
    }
    else {
      *(long *)(lVar2 + 0xe8) = in_RDI;
    }
    plVar1[0xd] = in_RDI;
    *(long *)(in_RDI + 0xf0) = lVar2;
    *(undefined8 *)(in_RDI + 0xe8) = 0;
    LOCK();
    plVar1[1] = plVar1[1] + 1;
    UNLOCK();
    LOCK();
    *plVar1 = *plVar1 + 1;
    UNLOCK();
    mi_lock_release((pthread_mutex_t *)0xad7824);
    bVar3 = false;
  }
  return;
}

Assistant:

static void mi_arena_segment_os_mark_abandoned(mi_segment_t* segment) {
  mi_assert(segment->memid.memkind != MI_MEM_ARENA);
  // not in an arena; we use a list of abandoned segments
  mi_subproc_t* const subproc = segment->subproc;
  mi_lock(&subproc->abandoned_os_lock) {
    // push on the tail of the list (important for the visitor)
    mi_segment_t* prev = subproc->abandoned_os_list_tail;
    mi_assert_internal(prev == NULL || prev->abandoned_os_next == NULL);
    mi_assert_internal(segment->abandoned_os_prev == NULL);
    mi_assert_internal(segment->abandoned_os_next == NULL);
    if (prev != NULL) { prev->abandoned_os_next = segment; }
    else { subproc->abandoned_os_list = segment; }
    subproc->abandoned_os_list_tail = segment;
    segment->abandoned_os_prev = prev;
    segment->abandoned_os_next = NULL;
    mi_atomic_increment_relaxed(&subproc->abandoned_os_list_count);
    mi_atomic_increment_relaxed(&subproc->abandoned_count);
    // and release the lock
  }
  return;
}